

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void visualizeBigSudoku(tuple<SudokuGitter,_SudokuGitter> *bigGitter)

{
  BigSudokuVisualizer visualizer;
  string local_f0;
  _Tuple_impl<0UL,_SudokuGitter,_SudokuGitter> local_d0;
  BigSudokuVisualizer local_80;
  
  std::_Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>::_Tuple_impl
            (&local_d0,&bigGitter->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>);
  BigSudokuVisualizer::BigSudokuVisualizer(&local_80,(tuple<SudokuGitter,_SudokuGitter> *)&local_d0)
  ;
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector((vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
             *)&local_d0.super__Head_base<0UL,_SudokuGitter,_false>);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector((vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
             *)&local_d0);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"output/big.html","");
  BigSudokuVisualizer::createHTML(&local_80,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.html_template._M_dataplus._M_p != &local_80.html_template.field_2) {
    operator_delete(local_80.html_template._M_dataplus._M_p);
  }
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector((vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
             *)&local_80.bigGitter.super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>.
                super__Head_base<0UL,_SudokuGitter,_false>);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector((vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
             *)&local_80);
  return;
}

Assistant:

void visualizeBigSudoku(tuple<SudokuGitter, SudokuGitter> bigGitter){
    BigSudokuVisualizer visualizer = BigSudokuVisualizer(bigGitter);
    visualizer.createHTML("output/big.html");
}